

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_draw(void)

{
  int iVar1;
  _func_void_int_int_uchar_float_ptr *p_Var2;
  rf_render_batch *prVar3;
  rf_mat mat;
  rf_mat right;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined8 uVar18;
  undefined8 in_stack_fffffffffffffeb8;
  long local_120;
  rf_int i_1;
  rf_int i;
  float local_108;
  int vertex_offset;
  rf_mat mat_mvp;
  rf_mat mat_model_view;
  rf_mat mat_projection;
  
  if (0 < ((rf__ctx->field_0).current_batch)->vertex_buffers
          [((rf__ctx->field_0).current_batch)->current_buffer].v_counter) {
    (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)
              (((rf__ctx->field_0).current_batch)->vertex_buffers
               [((rf__ctx->field_0).current_batch)->current_buffer].vao_id);
    (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)
              (0x8892,((rf__ctx->field_0).current_batch)->vertex_buffers
                      [((rf__ctx->field_0).current_batch)->current_buffer].vbo_id[0]);
    (*(rf__ctx->field_0).gfx_ctx.gl.BufferSubData)
              (0x8892,0,(long)((rf__ctx->field_0).current_batch)->vertex_buffers
                              [((rf__ctx->field_0).current_batch)->current_buffer].v_counter * 0xc,
               ((rf__ctx->field_0).current_batch)->vertex_buffers
               [((rf__ctx->field_0).current_batch)->current_buffer].vertices);
    (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)
              (0x8892,((rf__ctx->field_0).current_batch)->vertex_buffers
                      [((rf__ctx->field_0).current_batch)->current_buffer].vbo_id[1]);
    (*(rf__ctx->field_0).gfx_ctx.gl.BufferSubData)
              (0x8892,0,(long)((rf__ctx->field_0).current_batch)->vertex_buffers
                              [((rf__ctx->field_0).current_batch)->current_buffer].v_counter << 3,
               ((rf__ctx->field_0).current_batch)->vertex_buffers
               [((rf__ctx->field_0).current_batch)->current_buffer].texcoords);
    (*(rf__ctx->field_0).gfx_ctx.gl.BindBuffer)
              (0x8892,((rf__ctx->field_0).current_batch)->vertex_buffers
                      [((rf__ctx->field_0).current_batch)->current_buffer].vbo_id[2]);
    (*(rf__ctx->field_0).gfx_ctx.gl.BufferSubData)
              (0x8892,0,(long)((rf__ctx->field_0).current_batch)->vertex_buffers
                              [((rf__ctx->field_0).current_batch)->current_buffer].v_counter << 2,
               ((rf__ctx->field_0).current_batch)->vertex_buffers
               [((rf__ctx->field_0).current_batch)->current_buffer].colors);
    (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(0);
    memcpy(&mat_model_view.m11,&(rf__ctx->field_0).projection,0x40);
    memcpy(&mat_mvp.m11,&(rf__ctx->field_0).modelview,0x40);
    if (0 < ((rf__ctx->field_0).current_batch)->vertex_buffers
            [((rf__ctx->field_0).current_batch)->current_buffer].v_counter) {
      (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)((rf__ctx->field_0).current_shader.id);
      uVar18._0_4_ = (rf__ctx->field_0).projection.m0;
      uVar18._4_4_ = (rf__ctx->field_0).projection.m4;
      uVar4 = (rf__ctx->field_0).projection.m8;
      uVar5 = (rf__ctx->field_0).projection.m12;
      uVar6 = (rf__ctx->field_0).projection.m1;
      uVar7 = (rf__ctx->field_0).projection.m5;
      uVar8 = (rf__ctx->field_0).projection.m9;
      uVar9 = (rf__ctx->field_0).projection.m13;
      uVar10 = (rf__ctx->field_0).projection.m2;
      uVar11 = (rf__ctx->field_0).projection.m6;
      uVar12 = (rf__ctx->field_0).projection.m10;
      uVar13 = (rf__ctx->field_0).projection.m14;
      uVar14 = (rf__ctx->field_0).projection.m3;
      uVar15 = (rf__ctx->field_0).projection.m7;
      uVar16 = (rf__ctx->field_0).projection.m11;
      uVar17 = (rf__ctx->field_0).projection.m15;
      right.m7 = (float)uVar17;
      right.m3 = (float)uVar16;
      right.m14 = (float)uVar15;
      right.m10 = (float)uVar14;
      right.m6 = (float)uVar13;
      right.m2 = (float)uVar12;
      right.m13 = (float)uVar11;
      right.m9 = (float)uVar10;
      right.m5 = (float)uVar9;
      right.m1 = (float)uVar8;
      right.m12 = (float)uVar7;
      right.m8 = (float)uVar6;
      right.m4 = (float)uVar5;
      right.m0 = (float)uVar4;
      right.m11 = (float)(int)in_stack_fffffffffffffeb8;
      right.m15 = (float)(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20);
      rf_mat_mul(*(rf_mat *)&(rf__ctx->field_0).modelview.m8,right);
      p_Var2 = (rf__ctx->field_0).gfx_ctx.gl.UniformMatrix4fv;
      iVar1 = (rf__ctx->field_0).current_shader.locs[6];
      mat.m8 = mat_mvp.m8;
      mat.m12 = mat_mvp.m12;
      mat.m0 = mat_mvp.m0;
      mat.m4 = mat_mvp.m4;
      mat.m1 = mat_mvp.m1;
      mat.m5 = mat_mvp.m5;
      mat.m9 = mat_mvp.m9;
      mat.m13 = mat_mvp.m13;
      mat.m2 = mat_mvp.m2;
      mat.m6 = mat_mvp.m6;
      mat.m10 = mat_mvp.m10;
      mat.m14 = mat_mvp.m14;
      mat.m3 = mat_mvp.m3;
      mat.m7 = mat_mvp.m7;
      mat.m11 = (float)(int)uVar18;
      mat.m15 = (float)(int)((ulong)uVar18 >> 0x20);
      rf_mat_to_float16(mat);
      (*p_Var2)(iVar1,1,'\0',&local_108);
      (*(rf__ctx->field_0).gfx_ctx.gl.Uniform4f)
                ((rf__ctx->field_0).current_shader.locs[0xb],1.0,1.0,1.0,1.0);
      (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1i)((rf__ctx->field_0).current_shader.locs[0xe],0);
      i._4_4_ = 0;
      (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)
                (((rf__ctx->field_0).current_batch)->vertex_buffers
                 [((rf__ctx->field_0).current_batch)->current_buffer].vao_id);
      (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)(0x84c0);
      for (i_1 = 0; i_1 < ((rf__ctx->field_0).current_batch)->draw_calls_counter; i_1 = i_1 + 1) {
        (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)
                  (0xde1,((rf__ctx->field_0).current_batch)->draw_calls[i_1].texture_id);
        if ((((rf__ctx->field_0).current_batch)->draw_calls[i_1].mode == RF_LINES) ||
           (((rf__ctx->field_0).current_batch)->draw_calls[i_1].mode == RF_TRIANGLES)) {
          (*(rf__ctx->field_0).gfx_ctx.gl.DrawArrays)
                    (((rf__ctx->field_0).current_batch)->draw_calls[i_1].mode,i._4_4_,
                     ((rf__ctx->field_0).current_batch)->draw_calls[i_1].vertex_count);
        }
        else {
          (*(rf__ctx->field_0).gfx_ctx.gl.DrawElements)
                    (4,(((rf__ctx->field_0).current_batch)->draw_calls[i_1].vertex_count / 4) * 6,
                     0x1405,(void *)(((long)i._4_4_ & 0x3fffffffffffffffU) * 6));
        }
        i._4_4_ = ((rf__ctx->field_0).current_batch)->draw_calls[i_1].vertex_count +
                  ((rf__ctx->field_0).current_batch)->draw_calls[i_1].vertex_alignment + i._4_4_;
      }
      (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0xde1,0);
    }
    (*(rf__ctx->field_0).gfx_ctx.gl.BindVertexArray)(0);
    (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(0);
    ((rf__ctx->field_0).current_batch)->vertex_buffers
    [((rf__ctx->field_0).current_batch)->current_buffer].v_counter = 0;
    ((rf__ctx->field_0).current_batch)->vertex_buffers
    [((rf__ctx->field_0).current_batch)->current_buffer].tc_counter = 0;
    ((rf__ctx->field_0).current_batch)->vertex_buffers
    [((rf__ctx->field_0).current_batch)->current_buffer].c_counter = 0;
    ((rf__ctx->field_0).current_batch)->current_depth = -1.0;
    memcpy(&(rf__ctx->field_0).projection,&mat_model_view.m11,0x40);
    memcpy(&(rf__ctx->field_0).modelview,&mat_mvp.m11,0x40);
    for (local_120 = 0; local_120 < 0x100; local_120 = local_120 + 1) {
      ((rf__ctx->field_0).current_batch)->draw_calls[local_120].mode = RF_QUADS;
      ((rf__ctx->field_0).current_batch)->draw_calls[local_120].vertex_count = 0;
      ((rf__ctx->field_0).current_batch)->draw_calls[local_120].texture_id =
           (rf__ctx->field_0).default_texture_id;
    }
    ((rf__ctx->field_0).current_batch)->draw_calls_counter = 1;
    prVar3 = (rf__ctx->field_0).current_batch;
    prVar3->current_buffer = prVar3->current_buffer + 1;
    if (0 < ((rf__ctx->field_0).current_batch)->current_buffer) {
      ((rf__ctx->field_0).current_batch)->current_buffer = 0;
    }
  }
  return;
}

Assistant:

RF_API void rf_gfx_draw()
{
    // Only process data if we have data to process
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter > 0)
    {
        // Update default internal buffers (VAOs/VBOs) with vertex array data
        // NOTE: If there is not vertex data, buffers doesn't need to be updated (vertex_count > 0)
        // TODO: If no data changed on the CPU arrays --> No need to re-update GPU arrays (change flag required)
        {
            // Update vertex buffers data
            // Activate elements VAO
            rf_gl.BindVertexArray(rf_batch.vertex_buffers[rf_batch.current_buffer].vao_id);

            // Vertex positions buffer
            rf_gl.BindBuffer(GL_ARRAY_BUFFER, rf_batch.vertex_buffers[rf_batch.current_buffer].vbo_id[0]);
            rf_gl.BufferSubData(GL_ARRAY_BUFFER, 0, sizeof(float) * 3 * rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter, rf_batch.vertex_buffers[rf_batch.current_buffer].vertices);
            //rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 3 * 4 * rf_max_batch_elements, rf_ctx->gl_ctx.memory->vertex_buffers[rf_ctx->gl_ctx.current_buffer].vertices, GL_DYNAMIC_DRAW);  // Update all buffer

            // rf_texture coordinates buffer
            rf_gl.BindBuffer(GL_ARRAY_BUFFER, rf_batch.vertex_buffers[rf_batch.current_buffer].vbo_id[1]);
            rf_gl.BufferSubData(GL_ARRAY_BUFFER, 0, sizeof(float) * 2 * rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter, rf_batch.vertex_buffers[rf_batch.current_buffer].texcoords);
            //rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 2 * 4 * rf_max_batch_elements, rf_ctx->gl_ctx.memory->vertex_buffers[rf_ctx->gl_ctx.current_buffer].texcoords, GL_DYNAMIC_DRAW); // Update all buffer

            // Colors buffer
            rf_gl.BindBuffer(GL_ARRAY_BUFFER, rf_batch.vertex_buffers[rf_batch.current_buffer].vbo_id[2]);
            rf_gl.BufferSubData(GL_ARRAY_BUFFER, 0, sizeof(unsigned char) * 4 * rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter, rf_batch.vertex_buffers[rf_batch.current_buffer].colors);
            //rf_gl.BufferData(GL_ARRAY_BUFFER, sizeof(float) * 4 * 4 * rf_max_batch_elements, rf_ctx->gl_ctx.memory->vertex_buffers[rf_ctx->gl_ctx.current_buffer].colors, GL_DYNAMIC_DRAW);    // Update all buffer

            // NOTE: glMap_buffer() causes sync issue.
            // If GPU is working with this buffer, glMap_buffer() will wait(stall) until GPU to finish its job.
            // To avoid waiting (idle), you can call first rf_gl.BufferData() with NULL pointer before glMap_buffer().
            // If you do that, the previous data in PBO will be discarded and glMap_buffer() returns a new
            // allocated pointer immediately even if GPU is still working with the previous data.

            // Another option: map the buffer object into client's memory
            // Probably this code could be moved somewhere else...
            // rf_ctx->gl_ctx.memory->vertex_buffers[rf_ctx->gl_ctx.current_buffer].vertices = (float* )glMap_buffer(GL_ARRAY_BUFFER, GL_READ_WRITE);
            // if (rf_ctx->gl_ctx.memory->vertex_buffers[rf_ctx->gl_ctx.current_buffer].vertices)
            // {
            // Update vertex data
            // }
            // glUnmap_buffer(GL_ARRAY_BUFFER);

            // Unbind the current VAO
            rf_gl.BindVertexArray(0);
        }

        // NOTE: Stereo rendering is checked inside
        //rf_draw_buffers_default();
        {
            // Draw default internal buffers vertex data
            rf_mat mat_projection = rf_ctx.projection;
            rf_mat mat_model_view = rf_ctx.modelview;

            // Draw buffers
            if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter > 0)
            {
                // Set current shader and upload current MVP matrix
                rf_gl.UseProgram(rf_ctx.current_shader.id);

                // Create rf_ctx->gl_ctx.modelview-rf_ctx->gl_ctx.projection matrix
                rf_mat mat_mvp = rf_mat_mul(rf_ctx.modelview, rf_ctx.projection);

                rf_gl.UniformMatrix4fv(rf_ctx.current_shader.locs[RF_LOC_MATRIX_MVP], 1, false, rf_mat_to_float16(mat_mvp).v);
                rf_gl.Uniform4f(rf_ctx.current_shader.locs[RF_LOC_COLOR_DIFFUSE], 1.0f, 1.0f, 1.0f, 1.0f);
                rf_gl.Uniform1i(rf_ctx.current_shader.locs[RF_LOC_MAP_DIFFUSE], 0);    // Provided value refers to the texture unit (active)

                // TODO: Support additional texture units on custom shader
                //if (rf_ctx->gl_ctx.current_shader->locs[RF_LOC_MAP_SPECULAR] > 0) rf_gl.Uniform1i(rf_ctx->gl_ctx.current_shader.locs[RF_LOC_MAP_SPECULAR], 1);
                //if (rf_ctx->gl_ctx.current_shader->locs[RF_LOC_MAP_NORMAL] > 0) rf_gl.Uniform1i(rf_ctx->gl_ctx.current_shader.locs[RF_LOC_MAP_NORMAL], 2);

                // NOTE: Right now additional map textures not considered for default buffers drawing

                int vertex_offset = 0;

                rf_gl.BindVertexArray(rf_batch.vertex_buffers[rf_batch.current_buffer].vao_id);

                rf_gl.ActiveTexture(GL_TEXTURE0);

                for (rf_int i = 0; i < rf_batch.draw_calls_counter; i++)
                {
                    rf_gl.BindTexture(GL_TEXTURE_2D, rf_batch.draw_calls[i].texture_id);

                    // TODO: Find some way to bind additional textures --> Use global texture IDs? Register them on draw[i]?
                    //if (rf_ctx->gl_ctx.current_shader->locs[RF_LOC_MAP_SPECULAR] > 0) { rf_gl.ActiveTexture(GL_TEXTURE1); rf_gl.BindTexture(GL_TEXTURE_2D, textureUnit1_id); }
                    //if (rf_ctx->gl_ctx.current_shader->locs[RF_LOC_MAP_SPECULAR] > 0) { rf_gl.ActiveTexture(GL_TEXTURE2); rf_gl.BindTexture(GL_TEXTURE_2D, textureUnit2_id); }

                    if ((rf_batch.draw_calls[i].mode == RF_LINES) || (rf_batch.draw_calls[i].mode == RF_TRIANGLES))
                    {
                        rf_gl.DrawArrays(rf_batch.draw_calls[i].mode, vertex_offset, rf_batch.draw_calls[i].vertex_count);
                    }
                    else
                    {
                        #if defined(RAYFORK_GRAPHICS_BACKEND_GL_33)
                        // We need to define the number of indices to be processed: quadsCount*6
                        // NOTE: The final parameter tells the GPU the offset in bytes from the
                        // start of the index buffer to the location of the first index to process
                        rf_gl.DrawElements(GL_TRIANGLES, rf_batch.draw_calls[i].vertex_count / 4 * 6, GL_UNSIGNED_INT, (void*)(sizeof(unsigned int) * vertex_offset / 4 * 6));
                        #elif defined(RAYFORK_GRAPHICS_BACKEND_GL_ES3)
                        rf_gl.DrawElements(GL_TRIANGLES, rf_batch.draw_calls[i].vertex_count / 4 * 6, GL_UNSIGNED_SHORT, (void*)(sizeof(unsigned short) * vertex_offset / 4 * 6));
                        #endif
                    }

                    vertex_offset += (rf_batch.draw_calls[i].vertex_count + rf_batch.draw_calls[i].vertex_alignment);
                }

                rf_gl.BindTexture(GL_TEXTURE_2D, 0);
            }

            rf_gl.BindVertexArray(0);
            rf_gl.UseProgram(0);

            // Reset vertex counters for next frame
            rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter  = 0;
            rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter = 0;
            rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter  = 0;

            // Reset depth for next draw
            rf_batch.current_depth = -1.0f;

            // Restore rf_ctx->gl_ctx.projection/rf_ctx->gl_ctx.modelview matrices
            rf_ctx.projection = mat_projection;
            rf_ctx.modelview  = mat_model_view;

            // Reset rf_ctx->gl_ctx.draws array
            for (rf_int i = 0; i < RF_DEFAULT_BATCH_DRAW_CALLS_COUNT; i++)
            {
                rf_batch.draw_calls[i].mode = RF_QUADS;
                rf_batch.draw_calls[i].vertex_count = 0;
                rf_batch.draw_calls[i].texture_id = rf_ctx.default_texture_id;
            }

            rf_batch.draw_calls_counter = 1;

            // Change to next buffer in the list
            rf_batch.current_buffer++;
            if (rf_batch.current_buffer >= RF_DEFAULT_BATCH_VERTEX_BUFFERS_COUNT) rf_batch.current_buffer = 0;
        }
    }
}